

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

RefPtr<wabt::interp::Tag> * __thiscall
wabt::interp::Store::Alloc<wabt::interp::Tag,wabt::interp::Store&,wabt::interp::TagType&>
          (RefPtr<wabt::interp::Tag> *__return_storage_ptr__,Store *this,Store *args,TagType *args_1
          )

{
  Tag *pTVar1;
  Ref ref;
  Tag *local_60;
  undefined **local_58;
  undefined8 local_50;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_48;
  
  pTVar1 = (Tag *)operator_new(0x68);
  local_58 = &PTR__TagType_00225980;
  local_50 = *(undefined8 *)&(args_1->super_ExternType).kind;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_48,&args_1->signature);
  (pTVar1->super_Extern).super_Object.kind_ = Tag;
  *(undefined8 *)&(pTVar1->super_Extern).super_Object.finalizer_.super__Function_base._M_functor = 0
  ;
  *(undefined8 *)
   ((long)&(pTVar1->super_Extern).super_Object.finalizer_.super__Function_base._M_functor + 8) = 0;
  (pTVar1->super_Extern).super_Object.finalizer_.super__Function_base._M_manager =
       (_Manager_type)0x0;
  (pTVar1->super_Extern).super_Object.finalizer_._M_invoker = (_Invoker_type)0x0;
  (pTVar1->super_Extern).super_Object.host_info_ = (void *)0x0;
  (pTVar1->super_Extern).super_Object.self_.index = 0;
  (pTVar1->super_Extern).super_Object._vptr_Object = (_func_int **)&PTR__Tag_002257c8;
  (pTVar1->type_).super_ExternType._vptr_ExternType = (_func_int **)&PTR__TagType_00225980;
  *(undefined8 *)&(pTVar1->type_).super_ExternType.kind = local_50;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&(pTVar1->type_).signature,&local_48)
  ;
  local_60 = pTVar1;
  ref.index = FreeList<wabt::interp::Object*>::New<wabt::interp::Tag*>
                        ((FreeList<wabt::interp::Object*> *)&this->objects_,&local_60);
  local_58 = &PTR__TagType_00225980;
  if (local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  RefPtr<wabt::interp::Tag>::RefPtr(__return_storage_ptr__,this,ref);
  (__return_storage_ptr__->obj_->super_Extern).super_Object.self_.index = ref.index;
  return __return_storage_ptr__;
}

Assistant:

RefPtr<T> Store::Alloc(Args&&... args) {
  Ref ref{objects_.New(new T(std::forward<Args>(args)...))};
  RefPtr<T> ptr{*this, ref};
  ptr->self_ = ref;
  return ptr;
}